

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_rdiv>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  undefined1 auVar3 [64];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_rdiv op;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  int local_2f4;
  float *local_2e8;
  undefined1 (*local_2e0) [64];
  undefined1 (*local_2d8) [64];
  
  local_2e8 = in_RDX;
  local_2e0 = in_RSI;
  local_2d8 = in_RDI;
  for (local_2f4 = 0; local_2f4 + 0xf < in_ECX; local_2f4 = local_2f4 + 0x10) {
    auVar3 = vdivps_avx512f(*local_2e0,*local_2d8);
    local_3c0 = auVar3._0_8_;
    uStack_3b8 = auVar3._8_8_;
    uStack_3b0 = auVar3._16_8_;
    uStack_3a8 = auVar3._24_8_;
    uStack_3a0 = auVar3._32_8_;
    uStack_398 = auVar3._40_8_;
    uStack_390 = auVar3._48_8_;
    uStack_388 = auVar3._56_8_;
    *(undefined8 *)local_2e8 = local_3c0;
    *(undefined8 *)(local_2e8 + 2) = uStack_3b8;
    *(undefined8 *)(local_2e8 + 4) = uStack_3b0;
    *(undefined8 *)(local_2e8 + 6) = uStack_3a8;
    *(undefined8 *)(local_2e8 + 8) = uStack_3a0;
    *(undefined8 *)(local_2e8 + 10) = uStack_398;
    *(undefined8 *)(local_2e8 + 0xc) = uStack_390;
    *(undefined8 *)(local_2e8 + 0xe) = uStack_388;
    local_2d8 = local_2d8 + 1;
    local_2e0 = local_2e0 + 1;
    local_2e8 = local_2e8 + 0x10;
  }
  for (; local_2f4 + 7 < in_ECX; local_2f4 = local_2f4 + 8) {
    auVar2 = vdivps_avx(*(undefined1 (*) [32])*local_2e0,*(undefined1 (*) [32])*local_2d8);
    local_420 = auVar2._0_8_;
    uStack_418 = auVar2._8_8_;
    uStack_410 = auVar2._16_8_;
    uStack_408 = auVar2._24_8_;
    *(undefined8 *)local_2e8 = local_420;
    *(undefined8 *)(local_2e8 + 2) = uStack_418;
    *(undefined8 *)(local_2e8 + 4) = uStack_410;
    *(undefined8 *)(local_2e8 + 6) = uStack_408;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 0x20);
    local_2e0 = (undefined1 (*) [64])(*local_2e0 + 0x20);
    local_2e8 = local_2e8 + 8;
  }
  for (; local_2f4 + 3 < in_ECX; local_2f4 = local_2f4 + 4) {
    auVar1 = vdivps_avx(*(undefined1 (*) [16])*local_2e0,*(undefined1 (*) [16])*local_2d8);
    local_450 = auVar1._0_8_;
    uStack_448 = auVar1._8_8_;
    *(undefined8 *)local_2e8 = local_450;
    *(undefined8 *)(local_2e8 + 2) = uStack_448;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 0x10);
    local_2e0 = (undefined1 (*) [64])(*local_2e0 + 0x10);
    local_2e8 = local_2e8 + 4;
  }
  for (; local_2f4 < in_ECX; local_2f4 = local_2f4 + 1) {
    *local_2e8 = *(float *)*local_2e0 / *(float *)*local_2d8;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 4);
    local_2e0 = (undefined1 (*) [64])(*local_2e0 + 4);
    local_2e8 = local_2e8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}